

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

double __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::_mat(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i,
      basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_j)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  StorageIndex *pSVar4;
  StorageIndex *pSVar5;
  StorageIndex *pSVar6;
  const_iterator cVar7;
  long lVar8;
  runtime_error *this_00;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  __hashtable *__h;
  Scalar SVar14;
  
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_label_to_idx)._M_h,label_i);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    uVar2 = *(ulong *)((long)cVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28);
    cVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->_label_to_idx)._M_h,label_j);
    if (cVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      uVar3 = *(ulong *)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                               ._M_cur + 0x28);
      if (uVar2 == uVar3) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"No self-loop (mat(i,i)) allowed");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar9 = uVar3;
      if (uVar3 < uVar2) {
        uVar9 = uVar2;
        uVar2 = uVar3;
      }
      if ((((-1 < (long)uVar2) && (-1 < (long)uVar9)) &&
          ((long)uVar2 < (this->_quadmat).m_outerSize)) &&
         ((long)uVar9 < (this->_quadmat).m_innerSize)) {
        pSVar4 = (this->_quadmat).m_outerIndex;
        pSVar5 = (this->_quadmat).m_innerNonZeros;
        if (pSVar5 == (StorageIndex *)0x0) {
          iVar10 = pSVar4[uVar2 + 1];
        }
        else {
          iVar10 = pSVar5[uVar2] + pSVar4[uVar2];
        }
        iVar1 = (this->_quadmat).m_outerIndex[uVar2];
        lVar8 = (long)iVar1;
        SVar14 = 0.0;
        if (iVar1 < iVar10) {
          lVar11 = (long)iVar10;
          iVar10 = (int)uVar9;
          pSVar6 = (this->_quadmat).m_data.m_indices;
          lVar13 = lVar11 + -1;
          if (iVar10 != pSVar6[lVar11 + -1]) {
            while (lVar12 = lVar13, lVar8 < lVar12) {
              lVar13 = lVar12 + lVar8 >> 1;
              if (pSVar6[lVar13] < iVar10) {
                lVar8 = lVar13 + 1;
                lVar13 = lVar12;
              }
            }
            if (lVar11 <= lVar8) {
              return 0.0;
            }
            lVar13 = lVar8;
            if (iVar10 != pSVar6[lVar8]) {
              return 0.0;
            }
          }
          SVar14 = (this->_quadmat).m_data.m_values[lVar13];
        }
        return SVar14;
      }
      __assert_fail("row>=0 && row<rows() && col>=0 && col<cols()",
                    "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0xc0,
                    "Scalar Eigen::SparseMatrix<double, 1>::coeff(Index, Index) const [_Scalar = double, _Options = 1, _StorageIndex = int]"
                   );
    }
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

inline FloatType _mat( IndexType label_i, IndexType label_j ) const {
      size_t i = _label_to_idx.at( label_i );
      size_t j = _label_to_idx.at( label_j );

      if ( i != j )
        return _quadmat_get( std::min( i, j ), std::max( i, j ) );
      else
        throw std::runtime_error( "No self-loop (mat(i,i)) allowed" );
    }